

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

int64_t duckdb::DatePart::YearWeekOperator::Operation<duckdb::timestamp_t,long>(timestamp_t input)

{
  date_t input_00;
  long lVar1;
  
  input_00 = Timestamp::GetDate(input);
  lVar1 = Operation<duckdb::date_t,long>(input_00);
  return lVar1;
}

Assistant:

int64_t DatePart::YearWeekOperator::Operation(timestamp_t input) {
	return YearWeekOperator::Operation<date_t, int64_t>(Timestamp::GetDate(input));
}